

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

size_t propagatemark(global_State *g)

{
  byte *pbVar1;
  uint *puVar2;
  uint8_t uVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  bool bVar7;
  cTValue *pcVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  IRIns *pIVar12;
  uint uVar13;
  uint *puVar14;
  GCobj *pGVar15;
  IRIns *pIVar16;
  GCfunc *fn;
  GCtrace *T;
  IRIns *pIVar17;
  uint32_t i;
  uint uVar18;
  long lVar19;
  uint *puVar20;
  uint *puVar21;
  ulong uVar22;
  IRIns *pIVar23;
  
  uVar6 = (g->gc).gray.gcptr32;
  T = (GCtrace *)(ulong)uVar6;
  uVar3 = T->gct;
  T->marked = T->marked | 4;
  (g->gc).gray.gcptr32 = (T->gclist).gcptr32;
  switch(uVar3) {
  case '\x06':
    (T->gclist).gcptr32 = (g->gc).grayagain.gcptr32;
    (g->gc).grayagain.gcptr32 = uVar6;
    T->marked = T->marked & 0xfb;
    puVar14 = *(uint **)&T->nk;
    puVar20 = (uint *)(ulong)*(uint *)((long)&T->snap + 4);
    while (puVar21 = puVar20 + 2, puVar21 < puVar14) {
      puVar2 = puVar20 + 3;
      puVar20 = puVar21;
      if ((*puVar2 + 0xd < 9) && (((((GCobj *)(ulong)*puVar21)->gch).marked & 3) != 0)) {
        gc_mark(g,(GCobj *)(ulong)*puVar21);
      }
    }
    if ((g->gc).state == '\x02') {
      uVar6 = *(uint *)((long)&T->snap + 4);
      uVar13 = T->startins;
      for (; puVar21 < (uint *)((ulong)uVar6 + (ulong)uVar13 * 8); puVar21 = puVar21 + 2) {
        puVar21[1] = 0xffffffff;
      }
    }
    pGVar15 = (GCobj *)(ulong)*(uint *)((long)&T->snapmap + 4);
    if (((pGVar15->gch).marked & 3) != 0) {
      gc_mark(g,pGVar15);
    }
    pIVar17 = T->ir;
    pIVar23 = (IRIns *)(*(long *)&T->nk - 8);
    pIVar16 = (IRIns *)(ulong)*(uint *)((long)&T->snap + 4);
    do {
      pIVar17 = pIVar17 + -1;
      while( true ) {
        if (pIVar17 <= pIVar16) {
          pIVar17 = pIVar23 + 1;
          if ((IRIns *)(ulong)*(uint *)&T->snap < pIVar23 + 1) {
            pIVar17 = (IRIns *)(ulong)*(uint *)&T->snap;
          }
          lj_state_shrinkstack((lua_State *)T,(MSize)((ulong)((long)pIVar17 - (long)pIVar16) >> 3));
          return (ulong)T->startins * 8 + 0x40;
        }
        pGVar15 = (GCobj *)(ulong)(pIVar17->field_1).op12;
        pIVar12 = pIVar17;
        if ((pGVar15->gch).unused1 == '\0') {
          pIVar12 = pIVar17 + *(byte *)((ulong)(pGVar15->gch).metatable.gcptr32 - 0x39);
        }
        if (pIVar23 < pIVar12) {
          pIVar23 = pIVar12;
        }
        if (((pGVar15->gch).marked & 3) != 0) {
          gc_mark(g,pGVar15);
        }
        uVar6._0_2_ = *(IROpT *)((long)pIVar17 + 4);
        uVar6._2_2_ = *(IRRef1 *)((long)pIVar17 + 6);
        if (((long)(int)uVar6 & 3U) == 0) break;
        pIVar17 = (IRIns *)((long)pIVar17 - ((long)(int)uVar6 & 0xfffffffffffffff8U));
      }
      pIVar17 = pIVar17 + -(ulong)*(byte *)((ulong)uVar6 - 3);
    } while( true );
  case '\a':
    pbVar1 = (byte *)((ulong)*(uint *)&T->snapmap + 4);
    *pbVar1 = *pbVar1 & 0xfc;
    for (lVar19 = -(ulong)T->nk; lVar19 != 0; lVar19 = lVar19 + 1) {
      pGVar15 = (GCobj *)(ulong)*(uint *)((ulong)*(uint *)&T->ir + lVar19 * 4);
      if (((pGVar15->gch).marked & 3) != 0) {
        gc_mark(g,pGVar15);
      }
    }
    uVar5 = *(ushort *)((long)&T->snap + 6);
    if (uVar5 != 0) {
      gc_marktrace(g,(uint)uVar5);
    }
    sVar11 = (size_t)*(uint *)&T->snap;
    break;
  case '\b':
    if (((((GCobj *)(ulong)T->nins)->gch).marked & 3) != 0) {
      gc_mark(g,(GCobj *)(ulong)T->nins);
    }
    if ((char)T->nsnap == '\0') {
      if ((*(byte *)((ulong)*(uint *)&T->ir - 0x3c) & 3) != 0) {
        gc_mark(g,(GCobj *)((ulong)*(uint *)&T->ir - 0x40));
      }
      for (uVar22 = 0; uVar10 = (ulong)*(byte *)((long)&T->nsnap + 1), uVar22 < uVar10;
          uVar22 = uVar22 + 1) {
        pGVar15 = (GCobj *)(ulong)*(uint *)((long)&T->ir + uVar22 * 4 + 4);
        if (((pGVar15->gch).marked & 3) != 0) {
          gc_mark(g,pGVar15);
        }
      }
    }
    else {
      for (uVar22 = 0; uVar10 = (ulong)*(byte *)((long)&T->nsnap + 1), uVar22 < uVar10;
          uVar22 = uVar22 + 1) {
        if ((*(int *)((long)&T->snap + uVar22 * 8 + 4) + 0xdU < 9) &&
           (((((GCobj *)(ulong)*(uint *)(&T->snap + uVar22))->gch).marked & 3) != 0)) {
          gc_mark(g,(GCobj *)(ulong)*(uint *)(&T->snap + uVar22));
        }
      }
    }
    if ((char)T->nsnap == '\0') {
      sVar11 = uVar10 * 4 + 0x14;
    }
    else {
      sVar11 = uVar10 * 8 + 0x20;
    }
    break;
  default:
    gc_traverse_trace(g,T);
    sVar11 = (ulong)T->nsnap * 0xc + (ulong)(T->nins - T->nk) * 8 + (ulong)T->nsnapmap * 4 + 0x60;
    break;
  case '\v':
    pGVar15 = (GCobj *)(ulong)*(uint *)&T->ir;
    uVar13 = 0;
    if (pGVar15 == (GCobj *)0x0) {
LAB_0010f874:
      uVar6 = T->nk;
      for (uVar22 = 0; uVar6 != uVar22; uVar22 = uVar22 + 1) {
        if ((*(int *)((ulong)T->nins + 4 + uVar22 * 8) + 0xdU < 9) &&
           (pGVar15 = (GCobj *)(ulong)*(uint *)((ulong)T->nins + uVar22 * 8),
           ((pGVar15->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar15);
        }
      }
      bVar7 = true;
LAB_0010f8ab:
      uVar6 = T->nsnapmap;
      if (uVar6 != 0) {
        uVar22 = (ulong)*(uint *)((long)&T->ir + 4);
        for (uVar18 = 0; uVar18 <= uVar6; uVar18 = uVar18 + 1) {
          if (*(int *)(uVar22 + 4 + (ulong)uVar18 * 0x18) != -1) {
            puVar14 = (uint *)((ulong)uVar18 * 0x18 + uVar22);
            if ((((uVar13 & 8) == 0) && (puVar14[3] + 0xd < 9)) &&
               (((((GCobj *)(ulong)puVar14[2])->gch).marked & 3) != 0)) {
              gc_mark(g,(GCobj *)(ulong)puVar14[2]);
            }
            if (((bVar7) && (puVar14[1] + 0xd < 9)) &&
               (((((GCobj *)(ulong)*puVar14)->gch).marked & 3) != 0)) {
              gc_mark(g,(GCobj *)(ulong)*puVar14);
            }
          }
        }
      }
      if (0 < (int)uVar13) goto LAB_0010f930;
    }
    else {
      if (((pGVar15->gch).marked & 3) != 0) {
        gc_mark(g,pGVar15);
      }
      if (((((pGVar15->gch).unused1 & 8) != 0) ||
          (pcVar8 = lj_meta_cache(&pGVar15->tab,MM_mode,(GCstr *)(ulong)g->gcroot[3].gcptr32),
          pcVar8 == (cTValue *)0x0)) || (uVar13 = 0, (pcVar8->field_2).it != 0xfffffffb))
      goto LAB_0010f874;
      pcVar9 = (char *)((ulong)(pcVar8->u32).lo + 0x10);
      uVar13 = 0;
      while (cVar4 = *pcVar9, cVar4 != '\0') {
        pcVar9 = pcVar9 + 1;
        if (cVar4 == 'v') {
          uVar13 = uVar13 | 0x10;
        }
        else if (cVar4 == 'k') {
          uVar13 = uVar13 | 8;
        }
      }
      if (uVar13 == 0) {
        uVar13 = 0;
        goto LAB_0010f874;
      }
      if (g->gcroot[0x26].gcptr32 == uVar6) {
        uVar13 = 0xffffffef;
        goto LAB_0010f874;
      }
      T->marked = (byte)uVar13 | T->marked & 0xe7;
      (T->gclist).gcptr32 = (g->gc).weak.gcptr32;
      (g->gc).weak.gcptr32 = uVar6;
      if (uVar13 != 0x18) {
        if ((uVar13 & 0x10) == 0) goto LAB_0010f874;
        bVar7 = false;
        goto LAB_0010f8ab;
      }
LAB_0010f930:
      T->marked = T->marked & 0xfb;
    }
    lVar19 = 0;
    if (T->nsnapmap != 0) {
      lVar19 = (ulong)(T->nsnapmap + 1) * 0x18;
    }
    sVar11 = lVar19 + (ulong)T->nk * 8 + 0x20;
  }
  return sVar11;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}